

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O0

void __thiscall
ParticleArrayTest_PushBack_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>::
TestBody(ParticleArrayTest_PushBack_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>
         *this)

{
  undefined1 uVar1;
  bool bVar2;
  ParticleArray *in_stack_00000028;
  ParticleArray *in_stack_00000030;
  ParticleArrayTest<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_> *in_stack_00000038
  ;
  AssertionResult gtest_ar_;
  ParticleArray particlesCopy;
  int i;
  ParticleArray particles;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff4c;
  char *in_stack_ffffffffffffff50;
  Type in_stack_ffffffffffffff5c;
  BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *in_stack_ffffffffffffff60;
  AssertionResult local_98 [2];
  Message *in_stack_ffffffffffffff88;
  AssertHelper *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  AssertionResult *in_stack_ffffffffffffffa8;
  int local_24;
  
  pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>::ParticleArrayAoS
            ((ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_> *)0x221f29);
  for (local_24 = 0; local_24 < 0x11; local_24 = local_24 + 1) {
    BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>::randomParticle
              (in_stack_ffffffffffffff60);
    pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>::pushBack
              ((ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_> *)
               CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
               (ConstParticleRef)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  }
  pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>::ParticleArrayAoS
            ((ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_> *)
             CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
             (ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_> *)
             CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  uVar1 = ParticleArrayTest<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>::
          eqParticleArrays(in_stack_00000038,in_stack_00000030,in_stack_00000028);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(uVar1,in_stack_ffffffffffffff30),
             (bool)in_stack_ffffffffffffff2f);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_98);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff60);
    testing::internal::GetBoolAssertionFailureMessage
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (char *)in_stack_ffffffffffffff90);
    testing::internal::String::c_str((String *)&stack0xffffffffffffff48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
               in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
               (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff30));
    testing::internal::String::~String((String *)CONCAT17(uVar1,in_stack_ffffffffffffff30));
    testing::Message::~Message((Message *)0x222085);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x222102);
  pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>::~ParticleArrayAoS
            ((ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_> *)0x22211e);
  pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>::~ParticleArrayAoS
            ((ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_> *)0x22212b);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, PushBack)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles;
    for (int i = 0; i < 17; i++)
        particles.pushBack(this->randomParticle());
    ParticleArray particlesCopy(particles);
    ASSERT_TRUE(this->eqParticleArrays(particles, particlesCopy));
}